

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

ManagedDescriptor * __thiscall ManagedDescriptor::childMayInherit(ManagedDescriptor *this,bool yes)

{
  int __fd;
  bool bVar1;
  uint uVar2;
  FileDescriptor fd;
  bool yes_local;
  ManagedDescriptor *this_local;
  
  bVar1 = isValid(this);
  if (!bVar1) {
    __fd = this->_descriptor;
    if (yes) {
      uVar2 = fcntl(__fd,1);
      fcntl(__fd,2,(ulong)(uVar2 | 1));
    }
    else {
      uVar2 = fcntl(__fd,1);
      fcntl(__fd,2,(ulong)(uVar2 & 0xfffffffe));
    }
  }
  return this;
}

Assistant:

ManagedDescriptor &childMayInherit(bool yes) {
    if (isValid()) {
      return *this;
    }

    auto fd = _descriptor;

#if defined(_WIN32)
    SetHandleInformation(fd, HANDLE_FLAG_INHERIT, yes ? TRUE : FALSE);
#else
    if (yes) {
      fcntl(fd, F_SETFD, fcntl(fd, F_GETFD) | FD_CLOEXEC);
    } else {
      fcntl(fd, F_SETFD, fcntl(fd, F_GETFD) & ~FD_CLOEXEC);
    }
#endif
    return *this;
  }